

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O2

size_t __thiscall
EncodingConversion::decode
          (EncodingConversion *this,u16string *string,char *input_start,size_t input_length,
          bool is_last_chunk)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type __n;
  ulong uVar4;
  pointer pcVar5;
  undefined7 in_register_00000081;
  pointer output_end;
  float fVar6;
  char *output_pointer;
  char *input_pointer;
  undefined4 local_44;
  char *local_40;
  EncodingConversion *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000081,is_last_chunk);
  __n = string->_M_string_length;
  local_38 = this;
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  resize(string,input_length + __n);
  pcVar5 = (string->_M_dataplus)._M_p;
  output_pointer = (char *)(pcVar5 + __n);
  output_end = (pointer)((long)output_pointer + input_length * 2);
  bVar2 = false;
  input_pointer = input_start;
  local_40 = input_start;
  while( true ) {
    if ((input_start + input_length <= input_pointer) || (bVar2)) {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      resize(string,__n);
      return (long)input_pointer - (long)local_40;
    }
    iVar3 = convert(local_38,&input_pointer,input_start + input_length,&output_pointer,
                    (char *)output_end);
    __n = ((long)output_pointer - (long)pcVar5) / 2;
    if (iVar3 == 1) break;
    if (iVar3 == 2) goto LAB_0015048d;
    if (iVar3 != 3) goto LAB_0015050b;
    bVar2 = true;
    if ((char)local_44 != '\0') {
LAB_0015048d:
      input_pointer = input_pointer + 1;
      (string->_M_dataplus)._M_p[__n] = L'�';
      output_pointer = output_pointer + 2;
      __n = __n + 1;
LAB_0015050b:
      bVar2 = false;
    }
  }
  uVar1 = string->_M_string_length;
  fVar6 = (float)uVar1;
  fVar6 = fVar6 + fVar6;
  uVar4 = (ulong)fVar6;
  uVar4 = (long)(fVar6 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  resize(string,uVar4);
  pcVar5 = (string->_M_dataplus)._M_p;
  output_pointer = (char *)(uVar1 + (long)pcVar5);
  output_end = (pointer)(uVar4 + (long)pcVar5);
  goto LAB_0015050b;
}

Assistant:

size_t EncodingConversion::decode(u16string &string, const char *input_start,
                                  size_t input_length, bool is_last_chunk) {
  size_t previous_size = string.size();
  string.resize(previous_size + input_length);

  size_t new_size = previous_size;
  const char *input_pointer = input_start;
  const char *input_end = input_start + input_length;
  char *output_start = reinterpret_cast<char *>(&string[0]);
  char *output_pointer = output_start + previous_size * bytes_per_character;
  char *output_end = output_pointer + input_length * bytes_per_character;
  bool incomplete_sequence_at_chunk_end = false;

  while (input_pointer < input_end && !incomplete_sequence_at_chunk_end) {
    int conversion_result = convert(
      &input_pointer,
      input_end,
      &output_pointer,
      output_end
    );

    new_size = (output_pointer - output_start) / bytes_per_character;

    switch (conversion_result) {
      case Ok: break;

      // Encountered an incomplete multibyte sequence at end of the chunk. If
      // this is not the last chunk, then stop here, because maybe the
      // remainder of the character will occur at the beginning of the next
      // chunk. If this *is* the last chunk, then we must consume these bytes,
      // so we fall through to the next case and append the unicode
      // replacement character.
      case InvalidTrailing:
        if (!is_last_chunk) {
          incomplete_sequence_at_chunk_end = true;
          break;
        }

      // Encountered an invalid multibyte sequence. Append the unicode
      // replacement character and resume transcoding.
      case Invalid:
        input_pointer++;
        string[new_size] = replacement_character;
        output_pointer += bytes_per_character;
        new_size++;
        break;

      // Insufficient room in the output buffer to write all characters in the
      // input buffer. Grow the content vector and resume transcoding.
      case Partial:
        size_t old_size = string.size();
        size_t new_size = old_size * buffer_growth_factor;
        string.resize(new_size);
        output_start = reinterpret_cast<char *>(&string[0]);
        output_pointer = output_start + old_size;
        output_end = output_start + new_size;
        break;
    }
  }

  string.resize(new_size);
  return input_pointer - input_start;
}